

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldMetadata
          (MessageGenerator *this,Printer *printer)

{
  Formatter *pFVar1;
  _Rb_tree_color _Var2;
  uint uVar3;
  EnforceOptimizeMode EVar4;
  Formatter *pFVar5;
  once_flag *poVar6;
  _Base_ptr p_Var7;
  byte bVar8;
  undefined8 uVar9;
  MessageGenerator *pMVar10;
  bool bVar11;
  uint32 uVar12;
  int iVar13;
  FieldGenerator *pFVar14;
  mapped_type *pmVar15;
  char *pcVar16;
  Descriptor *pDVar17;
  LogMessage *other;
  long *plVar18;
  ulong uVar19;
  undefined8 *puVar20;
  _Base_ptr p_Var21;
  size_t sVar22;
  ulong *puVar23;
  undefined1 *options;
  ExtensionRange *pEVar24;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  undefined8 uVar25;
  _Base_ptr p_Var26;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  long lVar27;
  long lVar28;
  ulong uVar29;
  uint32 tag;
  string serializer;
  SaveState saver;
  int type;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Formatter format;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  sorted;
  _Alloc_hider local_238;
  size_type local_230;
  FieldDescriptor local_228 [8];
  undefined8 in_stack_fffffffffffffde0;
  key_type local_218;
  uint local_1f4;
  undefined1 local_1f0 [56];
  Options *local_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [2];
  undefined1 local_190 [16];
  Formatter local_180;
  undefined1 local_148 [16];
  undefined1 local_138 [40];
  undefined8 local_110;
  MessageGenerator *local_108;
  undefined1 local_100 [16];
  undefined1 local_f0 [24];
  _Base_ptr local_d8;
  string local_d0;
  Formatter local_b0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_78;
  string local_60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_40;
  FieldGeneratorMap *local_38;
  
  local_b0.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_b0.vars_._M_t,&(this->variables_)._M_t);
  iVar13 = 0;
  if ((this->options_).table_driven_serialization != true) goto LAB_002908c0;
  anon_unknown_0::SortFieldsByNumber(&local_78,this->descriptor_);
  local_1b8 = &this->options_;
  local_108 = this;
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\x01') {
    Formatter::operator()<>
              (&local_b0,"{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_), 0, 0, 0, nullptr},\n")
    ;
    local_138._0_8_ = (_Base_ptr)0x0;
    local_138._8_8_ = (_Base_ptr)0x0;
    local_138._16_8_ = (ExtensionRange **)0x0;
    local_40 = &this->variables_;
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::reserve((vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               *)local_138,(long)*(int *)(this->descriptor_ + 0x78));
    pDVar17 = this->descriptor_;
    if (0 < *(int *)(pDVar17 + 0x78)) {
      lVar28 = 0;
      lVar27 = 0;
      do {
        local_1f0._0_8_ = *(long *)(pDVar17 + 0x48) + lVar28;
        if (local_138._8_8_ == local_138._16_8_) {
          std::
          vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor::ExtensionRange_const*>
                    ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                      *)local_138,(iterator)local_138._8_8_,(ExtensionRange **)local_1f0);
        }
        else {
          *(undefined8 *)local_138._8_8_ = local_1f0._0_8_;
          local_138._8_8_ = local_138._8_8_ + 8;
        }
        lVar27 = lVar27 + 1;
        pDVar17 = this->descriptor_;
        lVar28 = lVar28 + 0x10;
      } while (lVar27 < *(int *)(pDVar17 + 0x78));
    }
    uVar9 = local_138._8_8_;
    uVar25 = local_138._0_8_;
    if (local_138._0_8_ != local_138._8_8_) {
      lVar28 = local_138._8_8_ - local_138._0_8_;
      uVar19 = lVar28 >> 3;
      lVar27 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar27 == 0; lVar27 = lVar27 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                (local_138._0_8_,local_138._8_8_,((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar28 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (uVar25,uVar9);
      }
      else {
        p_Var21 = (_Base_ptr)(uVar25 + 0x80);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (uVar25,p_Var21);
        for (; p_Var21 != (_Base_ptr)uVar9; p_Var21 = (_Base_ptr)&p_Var21->_M_parent) {
          p_Var7 = p_Var21[-1]._M_right;
          pEVar24 = *(ExtensionRange **)p_Var21;
          iVar13 = pEVar24->start;
          _Var2 = p_Var7->_M_color;
          p_Var26 = p_Var21;
          while (iVar13 < (int)_Var2) {
            *(_Base_ptr *)p_Var26 = p_Var7;
            p_Var7 = p_Var26[-1]._M_left;
            p_Var26 = (_Base_ptr)&p_Var26[-1]._M_right;
            _Var2 = p_Var7->_M_color;
          }
          *(ExtensionRange **)p_Var26 = pEVar24;
        }
      }
    }
    local_38 = &this->field_generators_;
    lVar27 = 0;
    local_110 = (FieldGeneratorMap *)((ulong)local_110._4_4_ << 0x20);
    do {
      uVar19 = (ulong)(int)local_110;
      uVar29 = (long)(local_138._8_8_ - local_138._0_8_) >> 3;
      if (uVar19 < uVar29) {
        do {
          if (((long)local_78.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3 != lVar27) &&
             (*(int *)(local_78.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar27] + 0x44) <=
              **(int **)(local_138._0_8_ + uVar19 * 8))) break;
          Formatter::operator()
                    (&local_b0,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::ExtensionSerializer)},\n"
                     ,*(int **)(local_138._0_8_ + uVar19 * 8),
                     *(int **)(local_138._0_8_ + uVar19 * 8) + 1);
          uVar19 = uVar19 + 1;
          uVar29 = (long)(local_138._8_8_ - local_138._0_8_) >> 3;
        } while (uVar19 < uVar29);
        local_110 = (FieldGeneratorMap *)CONCAT44(local_110._4_4_,(int)uVar19);
      }
      lVar28 = (long)local_78.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (lVar28 == lVar27) goto LAB_002907e6;
      pFVar5 = (Formatter *)
               local_78.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar27];
      iVar13 = *(int *)&pFVar5[1].vars_._M_t._M_impl.field_0x4;
      poVar6 = (once_flag *)(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (poVar6 != (once_flag *)0x0) {
        local_1f0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_190._0_8_ = pFVar5;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar6,(_func_void_FieldDescriptor_ptr **)local_1f0,(FieldDescriptor **)local_190
                  );
      }
      local_1f4 = iVar13 << 3 |
                  *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                           (ulong)*(uint *)&pFVar5[1].printer_ * 4);
      bVar11 = FieldDescriptor::is_packed((FieldDescriptor *)pFVar5);
      if (bVar11) {
        local_1f4 = *(int *)&pFVar5[1].vars_._M_t._M_impl.field_0x4 * 8 + 2;
      }
      FieldName_abi_cxx11_((string *)local_190,(cpp *)pFVar5,field_00);
      pMVar10 = local_108;
      if (pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left != (_Base_ptr)0x0) {
        std::__cxx11::string::_M_assign((string *)local_190);
      }
      local_1f0._0_8_ = local_1f0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"field_name","");
      Formatter::Set<std::__cxx11::string>
                (&local_b0,(string *)local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
      if ((ExtensionRange *)local_1f0._0_8_ != (ExtensionRange *)(local_1f0 + 0x10)) {
        operator_delete((void *)local_1f0._0_8_);
      }
      local_100._0_8_ = local_f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"nullptr","");
      poVar6 = (once_flag *)(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if (poVar6 != (once_flag *)0x0) {
        local_1f0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_238._M_p = (pointer)pFVar5;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar6,(_func_void_FieldDescriptor_ptr **)local_1f0,
                   (FieldDescriptor **)&local_238);
      }
      options = FieldDescriptor::kTypeToCppTypeMap;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)&pFVar5[1].printer_ * 4) ==
          10) {
        pDVar17 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
        if (*(char *)(*(long *)(pDVar17 + 0x20) + 0x4b) != '\x01') {
          pDVar17 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
          if (*(char *)(*(long *)(pDVar17 + 0x20) + 0x48) != '\0') goto LAB_002903c0;
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"TableStruct","");
          pDVar17 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
          UniqueName(&local_60,&local_d0,(string *)**(undefined8 **)(pDVar17 + 0x10),local_1b8);
          puVar20 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x3acad1);
          local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)local_148;
          p_Var21 = (_Base_ptr)(puVar20 + 2);
          if ((_Base_ptr)*puVar20 == p_Var21) {
            local_148._0_8_ = *(undefined8 *)p_Var21;
            local_148._8_8_ = puVar20[3];
          }
          else {
            local_148._0_8_ = *(undefined8 *)p_Var21;
            local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)*puVar20;
          }
          local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = puVar20[1];
          *puVar20 = p_Var21;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          puVar20 = (undefined8 *)
                    std::__cxx11::string::append
                              ((char *)((long)&local_180.vars_._M_t._M_impl.super__Rb_tree_header.
                                               _M_header + 0x18));
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          puVar23 = puVar20 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar20 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar23) {
            local_218.field_2._M_allocated_capacity = *puVar23;
            local_218.field_2._8_8_ = puVar20[3];
          }
          else {
            local_218.field_2._M_allocated_capacity = *puVar23;
            local_218._M_dataplus._M_p = (pointer)*puVar20;
          }
          local_218._M_string_length = puVar20[1];
          *puVar20 = puVar23;
          puVar20[1] = 0;
          *(undefined1 *)(puVar20 + 2) = 0;
          FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
          iVar13 = anon_unknown_0::FindMessageIndexInFile((Descriptor *)in_stack_fffffffffffffde0);
          local_1f0._0_8_ = local_1f0 + 0x10;
          local_1f0._8_8_ = FastInt32ToBufferLeft(iVar13,(char *)local_1f0._0_8_);
          local_1f0._8_8_ = local_1f0._8_8_ + -(long)(local_1f0 + 0x10);
          local_1b0 = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1b0,local_1f0._0_8_,
                     (char *)(local_1f0._8_8_ + local_1f0._0_8_));
          uVar25 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            uVar25 = local_218.field_2._M_allocated_capacity;
          }
          uVar19 = (long)(_Rb_tree_color *)local_218._M_string_length + local_1a8;
          if ((ulong)uVar25 < uVar19) {
            uVar29 = 0xf;
            if (local_1b0 != local_1a0) {
              uVar29 = local_1a0[0];
            }
            if (uVar29 < uVar19) goto LAB_002902b6;
            plVar18 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_1b0,0,(char *)0x0,
                                         (ulong)local_218._M_dataplus._M_p);
          }
          else {
LAB_002902b6:
            plVar18 = (long *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1b0);
          }
          local_238._M_p = (pointer)local_228;
          pFVar1 = (Formatter *)(plVar18 + 2);
          if ((Formatter *)*plVar18 == pFVar1) {
            local_228 = (FieldDescriptor  [8])pFVar1->printer_;
            in_stack_fffffffffffffde0 = plVar18[3];
          }
          else {
            local_228 = (FieldDescriptor  [8])pFVar1->printer_;
            local_238._M_p = (pointer)*plVar18;
          }
          local_230 = plVar18[1];
          *plVar18 = (long)pFVar1;
          plVar18[1] = 0;
          *(undefined1 *)&pFVar1->printer_ = 0;
          std::__cxx11::string::operator=((string *)local_100,(string *)&local_238);
          if ((Formatter *)local_238._M_p != (Formatter *)local_228) {
            operator_delete(local_238._M_p);
          }
          if (local_1b0 != local_1a0) {
            operator_delete(local_1b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p);
          }
          if (local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
              (_Base_ptr)local_148) {
            operator_delete(local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          goto LAB_002903c0;
        }
        FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
        iVar13 = anon_unknown_0::FindMessageIndexInFile((Descriptor *)in_stack_fffffffffffffde0);
        local_238._M_p._0_4_ = iVar13;
        pDVar17 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
        QualifiedClassName_abi_cxx11_
                  ((string *)local_1f0,(cpp *)pDVar17,(Descriptor *)local_1b8,(Options *)options);
        Formatter::operator()
                  (&local_b0,
                   "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(static_cast< ::$proto_ns$::internal::SpecialSerializer>(::$proto_ns$::internal::MapFieldSerializer< ::$proto_ns$::internal::MapEntryToMapField<$3$>::MapFieldType, $tablename$::serialization_table>))},\n"
                   ,&local_1f4,(int *)&local_238,(string *)local_1f0);
        if ((ExtensionRange *)local_1f0._0_8_ != (ExtensionRange *)(local_1f0 + 0x10)) {
          operator_delete((void *)local_1f0._0_8_);
        }
      }
      else {
LAB_002903c0:
        pFVar14 = FieldGeneratorMap::get(local_38,(FieldDescriptor *)pFVar5);
        uVar12 = anon_unknown_0::CalcFieldNum(pFVar14,(FieldDescriptor *)pFVar5,local_1b8);
        local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)
             CONCAT44(local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,
                      uVar12);
        if ((*(char *)(*(long *)&pFVar5[2].vars_._M_t._M_impl + 0x4d) == '\x01') &&
           (*(int *)((long)&pFVar5[1].printer_ + 4) != 3)) {
          poVar6 = (once_flag *)(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if (poVar6 != (once_flag *)0x0) {
            local_1f0._0_8_ = FieldDescriptor::TypeOnceInit;
            local_238._M_p = (pointer)pFVar5;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar6,(_func_void_FieldDescriptor_ptr **)local_1f0,
                       (FieldDescriptor **)&local_238);
          }
          if (*(int *)&pFVar5[1].printer_ == 0xb) {
            EVar4 = (pMVar10->options_).enforce_mode;
            if (EVar4 == kSpeed) {
              bVar8 = (pMVar10->options_).opensource_runtime;
            }
            else {
              if ((EVar4 == kLiteRuntime) ||
                 (*(int *)&(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right[4].
                           _M_parent[5].field_0x4 == 3)) goto LAB_002905f7;
              bVar8 = (pMVar10->options_).opensource_runtime & 1;
            }
            if (bVar8 == 0) {
              local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)
                   CONCAT44(local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
                            _4_4_,0x69);
              local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"proto_ns","");
              pmVar15 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](local_40,&local_218);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_238,"reinterpret_cast<const void*>(::",pmVar15);
              puVar20 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
              pEVar24 = (ExtensionRange *)(puVar20 + 2);
              if ((ExtensionRange *)*puVar20 == pEVar24) {
                local_1f0._16_4_ = pEVar24->start;
                local_1f0._20_4_ = pEVar24->end;
                local_1f0._24_8_ = puVar20[3];
                local_1f0._0_8_ = (ExtensionRange *)(local_1f0 + 0x10);
              }
              else {
                local_1f0._16_4_ = pEVar24->start;
                local_1f0._20_4_ = pEVar24->end;
                local_1f0._0_8_ = (ExtensionRange *)*puVar20;
              }
              local_1f0._8_8_ = puVar20[1];
              *puVar20 = pEVar24;
              puVar20[1] = 0;
              *(undefined1 *)(puVar20 + 2) = 0;
              std::__cxx11::string::operator=((string *)local_100,(string *)local_1f0);
              if ((ExtensionRange *)local_1f0._0_8_ != (ExtensionRange *)(local_1f0 + 0x10)) {
                operator_delete((void *)local_1f0._0_8_);
              }
              if ((Formatter *)local_238._M_p != (Formatter *)local_228) {
                operator_delete(local_238._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != &local_218.field_2) {
                operator_delete(local_218._M_dataplus._M_p);
              }
              if ((pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
                   (_Base_ptr)0x0) && (*(int *)(*(long *)(pMVar10->descriptor_ + 0x10) + 0x3c) != 3)
                 ) {
                if (pFVar5[1].vars_._M_t._M_impl.field_0x2 == '\0') {
                  p_Var21 = (_Base_ptr)
                            &pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                             [1]._M_parent;
                }
                else {
                  p_Var21 = pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                  if (p_Var21 == (_Base_ptr)0x0) {
                    p_Var21 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                              + 4;
                  }
                  else {
                    p_Var21 = (_Base_ptr)&p_Var21[2]._M_left;
                  }
                }
                if ((pMVar10->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(int)((ulong)((long)pFVar5 - (long)*(_Base_ptr *)p_Var21) >> 3) * 0x286bca1b]
                    == -1) goto LAB_002905d6;
              }
              else {
LAB_002905d6:
                std::__cxx11::string::append(local_100);
              }
              std::__cxx11::string::append(local_100);
            }
          }
        }
LAB_002905f7:
        if (*(char *)(*(long *)&pFVar5[2].vars_._M_t._M_impl + 0x4f) == '\x01') {
          Formatter::operator()
                    (&local_b0,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _weak_field_map_), $1$, $1$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n"
                     ,&local_1f4);
        }
        else {
          if (pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left == (_Base_ptr)0x0
             ) {
            pcVar16 = "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n";
            if (*(int *)(*(long *)(pMVar10->descriptor_ + 0x10) + 0x3c) != 3) {
              if (pFVar5[1].vars_._M_t._M_impl.field_0x2 == '\0') {
                p_Var21 = (_Base_ptr)
                          &pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1]
                           ._M_parent;
              }
              else {
                p_Var21 = pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                if (p_Var21 == (_Base_ptr)0x0) {
                  p_Var21 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                            4;
                }
                else {
                  p_Var21 = (_Base_ptr)&p_Var21[2]._M_left;
                }
              }
              pcVar16 = "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n"
              ;
              if ((pMVar10->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(int)((ulong)((long)pFVar5 - (long)*(_Base_ptr *)p_Var21) >> 3) * 0x286bca1b] !=
                  -1) {
                local_1f0._0_8_ = local_1f0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1f0,"hasbitsoffset","");
                if (pFVar5[1].vars_._M_t._M_impl.field_0x2 == '\0') {
                  p_Var21 = (_Base_ptr)
                            &pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                             [1]._M_parent;
                }
                else {
                  p_Var21 = pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                  if (p_Var21 == (_Base_ptr)0x0) {
                    p_Var21 = (pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                              + 4;
                  }
                  else {
                    p_Var21 = (_Base_ptr)&p_Var21[2]._M_left;
                  }
                }
                Formatter::Set<int>(&local_b0,(string *)local_1f0,
                                    (pMVar10->has_bit_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                                    (int)((ulong)((long)pFVar5 - (long)*(_Base_ptr *)p_Var21) >> 3)
                                    * 0x286bca1b);
                if ((ExtensionRange *)local_1f0._0_8_ != (ExtensionRange *)(local_1f0 + 0x10)) {
                  operator_delete((void *)local_1f0._0_8_);
                }
                pcVar16 = 
                "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + $hasbitsoffset$, $2$, $3$},\n"
                ;
              }
            }
          }
          else {
            local_1f0._0_8_ = local_1f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"oneofoffset","");
            p_Var21 = pFVar5[1].vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_238._M_p =
                 (pointer)((long)((int)((ulong)((long)p_Var21 - (long)p_Var21->_M_left[1]._M_left)
                                       >> 4) * -0x55555555) << 2);
            Formatter::Set<unsigned_long>(&local_b0,(string *)local_1f0,(unsigned_long *)&local_238)
            ;
            if ((ExtensionRange *)local_1f0._0_8_ != (ExtensionRange *)(local_1f0 + 0x10)) {
              operator_delete((void *)local_1f0._0_8_);
            }
            pcVar16 = 
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + $oneofoffset$, $2$, $3$},\n"
            ;
          }
          Formatter::operator()
                    (&local_b0,pcVar16,&local_1f4,
                     (int *)((long)&local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header +
                            0x18),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100)
          ;
        }
      }
      if ((Formatter *)local_100._0_8_ != (Formatter *)local_f0) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((Formatter *)local_190._0_8_ != &local_180) {
        operator_delete((void *)local_190._0_8_);
      }
      lVar27 = lVar27 + 1;
    } while( true );
  }
  local_110 = &this->field_generators_;
  lVar27 = 0;
  do {
    pFVar5 = (Formatter *)
             local_78.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar27];
    pFVar14 = FieldGeneratorMap::get(local_110,(FieldDescriptor *)pFVar5);
    iVar13 = *(int *)&pFVar5[1].vars_._M_t._M_impl.field_0x4;
    poVar6 = (once_flag *)(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (poVar6 != (once_flag *)0x0) {
      local_190._0_8_ = FieldDescriptor::TypeOnceInit;
      local_100._0_8_ = pFVar5;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (poVar6,(_func_void_FieldDescriptor_ptr **)local_190,(FieldDescriptor **)local_100);
    }
    uVar3 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                     (ulong)*(uint *)&pFVar5[1].printer_ * 4);
    local_100._8_4_ = _S_red;
    local_f0._0_8_ = (Printer *)0x0;
    local_f0._8_8_ = local_100 + 8;
    local_d8 = (_Base_ptr)0x0;
    local_f0._16_8_ = local_f0._8_8_;
    QualifiedClassName_abi_cxx11_
              ((string *)local_190,(cpp *)local_108->descriptor_,(Descriptor *)local_1b8,
               (Options *)0x0);
    local_238._M_p = (pointer)local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"classtype","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)&local_238);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)local_190);
    field = extraout_RDX;
    if ((FieldDescriptor *)local_238._M_p != local_228) {
      operator_delete(local_238._M_p);
      field = extraout_RDX_00;
    }
    if ((Formatter *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_);
      field = extraout_RDX_01;
    }
    FieldName_abi_cxx11_((string *)local_190,(cpp *)pFVar5,field);
    local_238._M_p = (pointer)local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"field_name","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)&local_238);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)local_190);
    if ((FieldDescriptor *)local_238._M_p != local_228) {
      operator_delete(local_238._M_p);
    }
    if ((Formatter *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_);
    }
    local_190._0_8_ = &local_180;
    pcVar16 = FastUInt32ToBufferLeft(iVar13 << 3 | uVar3,(char *)&local_180);
    local_190._8_8_ = (long)pcVar16 - (long)&local_180;
    local_238._M_p = (pointer)local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,local_190._0_8_,(char *)(local_190._0_8_ + local_190._8_8_));
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"tag","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,&local_218);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_238._M_p != local_228) {
      operator_delete(local_238._M_p);
    }
    local_190._0_8_ = &local_180;
    pcVar16 = FastInt32ToBufferLeft((int32)lVar27,(char *)&local_180);
    local_190._8_8_ = (long)pcVar16 - (long)&local_180;
    local_238._M_p = (pointer)local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,local_190._0_8_,(char *)(local_190._0_8_ + local_190._8_8_));
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"hasbit","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,&local_218);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((FieldDescriptor *)local_238._M_p != local_228) {
      operator_delete(local_238._M_p);
    }
    uVar12 = anon_unknown_0::CalcFieldNum(pFVar14,(FieldDescriptor *)pFVar5,local_1b8);
    local_190._0_8_ = &local_180;
    pcVar16 = FastUInt32ToBufferLeft(uVar12,(char *)&local_180);
    local_190._8_8_ = (long)pcVar16 - (long)&local_180;
    local_238._M_p = (pointer)local_228;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_238,local_190._0_8_,(char *)(local_190._0_8_ + local_190._8_8_));
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"type","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,&local_218);
    std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((Formatter *)local_238._M_p != (Formatter *)local_228) {
      operator_delete(local_238._M_p);
    }
    local_190._0_8_ = &local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"ptr","");
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_100,(key_type *)local_190);
    std::__cxx11::string::_M_replace((ulong)pmVar15,0,(char *)pmVar15->_M_string_length,0x397494);
    if ((Formatter *)local_190._0_8_ != &local_180) {
      operator_delete((void *)local_190._0_8_);
    }
    poVar6 = (once_flag *)(pFVar5->vars_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (poVar6 != (once_flag *)0x0) {
      local_190._0_8_ = FieldDescriptor::TypeOnceInit;
      local_238._M_p = (pointer)pFVar5;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (poVar6,(_func_void_FieldDescriptor_ptr **)local_190,(FieldDescriptor **)&local_238)
      ;
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)&pFVar5[1].printer_ * 4) == 10
       ) {
      pDVar17 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
      if (*(char *)(*(long *)(pDVar17 + 0x20) + 0x4b) == '\x01') {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_1f0,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x708);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_1f0,
                           "CHECK failed: !IsMapEntryMessage(field->message_type()): ");
        internal::LogFinisher::operator=((LogFinisher *)local_190,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_1f0);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"TableStruct","");
      pDVar17 = FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
      UniqueName(&local_60,&local_d0,(string *)**(undefined8 **)(pDVar17 + 0x10),local_1b8);
      plVar18 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x3acad1);
      local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_148;
      p_Var21 = (_Base_ptr)(plVar18 + 2);
      if ((_Base_ptr)*plVar18 == p_Var21) {
        local_148._0_8_ = *(undefined8 *)p_Var21;
        local_148._8_8_ = plVar18[3];
      }
      else {
        local_148._0_8_ = *(undefined8 *)p_Var21;
        local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)*plVar18;
      }
      local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = plVar18[1];
      *plVar18 = (long)p_Var21;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      plVar18 = (long *)std::__cxx11::string::append
                                  ((char *)((long)&local_180.vars_._M_t._M_impl.
                                                   super__Rb_tree_header._M_header + 0x18));
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      puVar23 = (ulong *)(plVar18 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar18 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar23) {
        local_218.field_2._M_allocated_capacity = *puVar23;
        local_218.field_2._8_8_ = plVar18[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *puVar23;
        local_218._M_dataplus._M_p = (pointer)*plVar18;
      }
      local_218._M_string_length = plVar18[1];
      *plVar18 = (long)puVar23;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      FieldDescriptor::message_type((FieldDescriptor *)pFVar5);
      iVar13 = anon_unknown_0::FindMessageIndexInFile((Descriptor *)in_stack_fffffffffffffde0);
      local_190._0_8_ = &local_180;
      pcVar16 = FastInt32ToBufferLeft(iVar13,(char *)&local_180);
      local_190._8_8_ = (long)pcVar16 - (long)&local_180;
      local_1b0 = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1b0,local_190._0_8_,(char *)(local_190._0_8_ + local_190._8_8_));
      uVar25 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar25 = local_218.field_2._M_allocated_capacity;
      }
      uVar19 = (long)(_Rb_tree_color *)local_218._M_string_length + local_1a8;
      if ((ulong)uVar25 < uVar19) {
        uVar29 = 0xf;
        if (local_1b0 != local_1a0) {
          uVar29 = local_1a0[0];
        }
        if (uVar29 < uVar19) goto LAB_0028fb17;
        plVar18 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_1b0,0,(char *)0x0,
                                     (ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_0028fb17:
        plVar18 = (long *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1b0);
      }
      local_238._M_p = (pointer)local_228;
      pFVar5 = (Formatter *)(plVar18 + 2);
      if ((Formatter *)*plVar18 == pFVar5) {
        local_228 = (FieldDescriptor  [8])pFVar5->printer_;
        in_stack_fffffffffffffde0 = plVar18[3];
      }
      else {
        local_228 = (FieldDescriptor  [8])pFVar5->printer_;
        local_238._M_p = (pointer)*plVar18;
      }
      local_230 = plVar18[1];
      *plVar18 = (long)pFVar5;
      plVar18[1] = 0;
      *(undefined1 *)&pFVar5->printer_ = 0;
      local_138._0_8_ = local_138 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"ptr","");
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_100,(key_type *)local_138);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)&local_238);
      if ((_Base_ptr)local_138._0_8_ != (_Base_ptr)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_);
      }
      if ((Formatter *)local_238._M_p != (Formatter *)local_228) {
        operator_delete(local_238._M_p);
      }
      if (local_1b0 != local_1a0) {
        operator_delete(local_1b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p);
      }
      if (local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right !=
          (_Base_ptr)local_148) {
        operator_delete(local_180.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    local_190._0_8_ = &local_b0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_190 + 8),&local_b0.vars_._M_t);
    Formatter::AddMap(&local_b0,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_100);
    Formatter::operator()<>
              (&local_b0,
               "{PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, $field_name$_), $tag$,PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, _has_bits_) * 8 + $hasbit$, $type$, $ptr$},\n"
              );
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::swap((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_190._0_8_ + 8),
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_190 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_190 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_100);
    lVar27 = lVar27 + 1;
  } while (lVar27 == 1);
  iVar13 = 2;
  goto LAB_002908a6;
LAB_002907e6:
  EVar4 = (local_108->options_).enforce_mode;
  if (EVar4 == kSpeed) {
    pcVar16 = "UnknownFieldSetSerializer";
  }
  else if (EVar4 == kLiteRuntime) {
    pcVar16 = "UnknownFieldSerializerLite";
  }
  else {
    pcVar16 = "UnknownFieldSetSerializer";
    if (*(int *)(*(long *)(*(long *)(local_108->descriptor_ + 0x10) + 0x88) + 0xa4) == 3) {
      pcVar16 = "UnknownFieldSerializerLite";
    }
  }
  local_1f0._0_8_ = (ExtensionRange *)(local_1f0 + 0x10);
  sVar22 = strlen(pcVar16);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,pcVar16,pcVar16 + sVar22);
  Formatter::operator()
            (&local_b0,
             "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::$1$)},\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
  if ((ExtensionRange *)local_1f0._0_8_ != (ExtensionRange *)(local_1f0 + 0x10)) {
    operator_delete((void *)local_1f0._0_8_);
  }
  if ((_Base_ptr)local_138._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_138._0_8_);
  }
  iVar13 = (int)uVar29 + (int)lVar28 + 2;
LAB_002908a6:
  if (local_78.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_002908c0:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0.vars_._M_t);
  return iVar13;
}

Assistant:

int MessageGenerator::GenerateFieldMetadata(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!options_.table_driven_serialization) {
    return 0;
  }

  std::vector<const FieldDescriptor*> sorted = SortFieldsByNumber(descriptor_);
  if (IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < 2; i++) {
      const FieldDescriptor* field = sorted[i];
      const FieldGenerator& generator = field_generators_.get(field);

      uint32 tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormat::WireTypeForFieldType(field->type()));

      std::map<std::string, std::string> vars;
      vars["classtype"] = QualifiedClassName(descriptor_, options_);
      vars["field_name"] = FieldName(field);
      vars["tag"] = StrCat(tag);
      vars["hasbit"] = StrCat(i);
      vars["type"] = StrCat(CalcFieldNum(generator, field, options_));
      vars["ptr"] = "nullptr";
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        GOOGLE_CHECK(!IsMapEntryMessage(field->message_type()));
        vars["ptr"] =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
      Formatter::SaveState saver(&format);
      format.AddMap(vars);
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, $field_name$_), $tag$,"
          "PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, _has_bits_) * 8 + $hasbit$, $type$, "
          "$ptr$},\n");
    }
    return 2;
  }
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_),"
      " 0, 0, 0, nullptr},\n");
  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  sorted_extensions.reserve(descriptor_->extension_range_count());
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  for (int i = 0, extension_idx = 0; /* no range */; i++) {
    for (; extension_idx < sorted_extensions.size() &&
           (i == sorted.size() ||
            sorted_extensions[extension_idx]->start < sorted[i]->number());
         extension_idx++) {
      const Descriptor::ExtensionRange* range =
          sorted_extensions[extension_idx];
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), "
          "$1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::ExtensionSerializer)},\n",
          range->start, range->end);
    }
    if (i == sorted.size()) break;
    const FieldDescriptor* field = sorted[i];

    uint32 tag = internal::WireFormatLite::MakeTag(
        field->number(), WireFormat::WireTypeForFieldType(field->type()));
    if (field->is_packed()) {
      tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    }

    std::string classfieldname = FieldName(field);
    if (field->containing_oneof()) {
      classfieldname = field->containing_oneof()->name();
    }
    format.Set("field_name", classfieldname);
    std::string ptr = "nullptr";
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsMapEntryMessage(field->message_type())) {
        format(
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, "
            "::$proto_ns$::internal::FieldMetadata::kSpecial, "
            "reinterpret_cast<const void*>(static_cast< "
            "::$proto_ns$::internal::SpecialSerializer>("
            "::$proto_ns$::internal::MapFieldSerializer< "
            "::$proto_ns$::internal::MapEntryToMapField<"
            "$3$>::MapFieldType, "
            "$tablename$::serialization_table>))},\n",
            tag, FindMessageIndexInFile(field->message_type()),
            QualifiedClassName(field->message_type(), options_));
        continue;
      } else if (!field->message_type()->options().message_set_wire_format()) {
        // message_set doesn't have the usual table and we need to
        // dispatch to generated serializer, hence ptr stays zero.
        ptr =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
    }

    const FieldGenerator& generator = field_generators_.get(field);
    int type = CalcFieldNum(generator, field, options_);

    if (IsLazy(field, options_)) {
      type = internal::FieldMetadata::kSpecial;
      ptr = "reinterpret_cast<const void*>(::" + variables_["proto_ns"] +
            "::internal::LazyFieldSerializer";
      if (field->containing_oneof()) {
        ptr += "OneOf";
      } else if (!HasFieldPresence(descriptor_->file()) ||
                 has_bit_indices_[field->index()] == -1) {
        ptr += "NoPresence";
      }
      ptr += ")";
    }

    if (field->options().weak()) {
      // TODO(gerbens) merge weak fields into ranges
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "$classtype$, _weak_field_map_), $1$, $1$, "
          "::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n",
          tag);
    } else if (field->containing_oneof()) {
      format.Set("oneofoffset",
                 sizeof(uint32) * field->containing_oneof()->index());
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$,"
          " PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + "
          "$oneofoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else if (HasFieldPresence(descriptor_->file()) &&
               has_bit_indices_[field->index()] != -1) {
      format.Set("hasbitsoffset", has_bit_indices_[field->index()]);
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + "
          "$hasbitsoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else {
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, ~0u, $2$, $3$},\n",
          tag, type, ptr);
    }
  }
  int num_field_metadata = 1 + sorted.size() + sorted_extensions.size();
  num_field_metadata++;
  std::string serializer = UseUnknownFieldSet(descriptor_->file(), options_)
                               ? "UnknownFieldSetSerializer"
                               : "UnknownFieldSerializerLite";
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, "
      "::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const "
      "void*>(::$proto_ns$::internal::$1$)},\n",
      serializer);
  return num_field_metadata;
}